

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<unsigned_long>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<unsigned_long>_> *opt)

{
  element_type *peVar1;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *ptVar2;
  initializer_list<unsigned_long> __l;
  allocator_type local_41;
  element_type local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  ptVar2 = boost::program_options::value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0);
  peVar1 = (((opt->
             super___shared_ptr<VW::config::typed_option<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->m_default_value).
           super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_40 = *peVar1;
    __l._M_len = 1;
    __l._M_array = &local_40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__l,&local_41);
    boost::program_options::
    typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char>::default_value
              (ptVar2,&local_38);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  ptVar2 = add_notifier<unsigned_long>(this,opt,ptVar2);
  ptVar2->m_composing = true;
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}